

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  long in_RDI;
  u8 eOrigLock;
  int rc;
  int in_stack_ffffffffffffffec;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  uVar2 = CONCAT13(*(undefined1 *)(in_RDI + 0x16),in_stack_fffffffffffffff0);
  iVar1 = pagerLockDb((Pager *)CONCAT44(0xaaaaaaaa,uVar2),in_stack_ffffffffffffffec);
  if (iVar1 != 0) {
    pagerUnlockDb((Pager *)CONCAT44(iVar1,uVar2),in_stack_ffffffffffffffec);
  }
  return iVar1;
}

Assistant:

static int pagerExclusiveLock(Pager *pPager){
  int rc;                         /* Return code */
  u8 eOrigLock;                   /* Original lock */

  assert( pPager->eLock>=SHARED_LOCK );
  eOrigLock = pPager->eLock;
  rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
  if( rc!=SQLITE_OK ){
    /* If the attempt to grab the exclusive lock failed, release the
    ** pending lock that may have been obtained instead.  */
    pagerUnlockDb(pPager, eOrigLock);
  }

  return rc;
}